

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

void makeFullFilename(char *path,char *name,char *filename,int32_t capacity)

{
  size_t sVar1;
  char *pcVar2;
  char *local_30;
  char *s;
  int32_t capacity_local;
  char *filename_local;
  char *name_local;
  char *path_local;
  
  local_30 = filename;
  if ((path != (char *)0x0) && (local_30 = filename, *path != '\0')) {
    sVar1 = strlen(path);
    if (capacity <= (int)sVar1 + 1) {
      fprintf(_stderr,"pathname too long: \"%s\"\n",path);
      exit(0xf);
    }
    strcpy(filename,path);
    pcVar2 = strchr(filename,0);
    local_30 = pcVar2;
    if ((pcVar2[-1] != '/') && (pcVar2[-1] != '/')) {
      local_30 = pcVar2 + 1;
      *pcVar2 = '/';
    }
  }
  sVar1 = strlen(name);
  if (((int)local_30 - (int)filename) + (int)sVar1 < capacity) {
    strcpy(local_30,name);
    return;
  }
  fprintf(_stderr,"path/filename too long: \"%s%s\"\n",filename,name);
  exit(0xf);
}

Assistant:

static void
makeFullFilename(const char *path, const char *name,
                 char *filename, int32_t capacity) {
    char *s;

    // prepend the path unless NULL or empty
    if(path!=NULL && path[0]!=0) {
        if((int32_t)(strlen(path)+1)>=capacity) {
            fprintf(stderr, "pathname too long: \"%s\"\n", path);
            exit(U_BUFFER_OVERFLOW_ERROR);
        }
        strcpy(filename, path);

        // make sure the path ends with a file separator
        s=strchr(filename, 0);
        if(*(s-1)!=U_FILE_SEP_CHAR && *(s-1)!=U_FILE_ALT_SEP_CHAR) {
            *s++=U_FILE_SEP_CHAR;
        }
    } else {
        s=filename;
    }

    // turn the name into a filename, turn tree separators into file separators
    if((int32_t)((s-filename)+strlen(name))>=capacity) {
        fprintf(stderr, "path/filename too long: \"%s%s\"\n", filename, name);
        exit(U_BUFFER_OVERFLOW_ERROR);
    }
    strcpy(s, name);
    treeToPath(s);
}